

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::HttpSocket::_DequeueMore(HttpSocket *this)

{
  _Map_pointer ppRVar1;
  Request *req;
  bool bVar2;
  
  _FinishRequest(this);
  ppRVar1 = (this->_requestQ).c.
            super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  req = (this->_requestQ).c.super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->_requestQ).c.
             super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(this->_requestQ).c.
             super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) * -0x7b425ed097b425ed +
      (((long)ppRVar1 -
        (long)(this->_requestQ).c.
              super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
              super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(ppRVar1 == (_Map_pointer)0x0)) * 2 !=
      ((long)(this->_requestQ).c.
             super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
             super__Deque_impl_data._M_start._M_last - (long)req >> 3) * 0x7b425ed097b425ed) {
    bVar2 = _EnqueueOrSend(this,req,false);
    if (bVar2) {
      std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::pop_front
                (&(this->_requestQ).c);
      return;
    }
  }
  return;
}

Assistant:

void HttpSocket::_DequeueMore(void)
{
    traceprint("HttpSocket::_DequeueMore, Q = %u\n", (unsigned)_requestQ.size());
    _FinishRequest(); // In case this was not done yet.

    // _inProgress is known to be false here
    if(_requestQ.size()) // still have other requests queued?
        if(_EnqueueOrSend(_requestQ.front(), false)) // could we send?
            _requestQ.pop(); // if so, we are done with this request

    // otherwise, we are done for now. socket is kept alive for future sends. Nothing to do.
}